

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  istream *this;
  ostream *poVar1;
  int iVar2;
  int i;
  int iVar3;
  int x;
  int m;
  int n;
  stack<int> b;
  stack<int> a;
  
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x105150) = 0;
  CP::stack<int>::stack(&a);
  CP::stack<int>::stack(&b);
  this = (istream *)std::istream::operator>>((istream *)&std::cin,&n);
  std::istream::operator>>(this,&m);
  for (iVar3 = 0; iVar3 < n; iVar3 = iVar3 + 1) {
    std::istream::operator>>((istream *)&std::cin,&x);
    CP::stack<int>::push(&a,&x);
  }
  for (iVar3 = 0; iVar3 < m; iVar3 = iVar3 + 1) {
    std::istream::operator>>((istream *)&std::cin,&x);
    CP::stack<int>::push(&b,&x);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"a.compare_reserve(b) = ");
  iVar2 = ((int)a.mCap - ((int)a.mSize + (int)b.mCap)) + (int)b.mSize;
  iVar3 = iVar2 >> 0x1f;
  if (0 < iVar2) {
    iVar3 = 1;
  }
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar3);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"b.compare_reserve(a) = ");
  iVar2 = ((int)b.mCap - ((int)b.mSize + (int)a.mCap)) + (int)a.mSize;
  iVar3 = 1;
  if (iVar2 < 1) {
    iVar3 = iVar2 >> 0x1f;
  }
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar3);
  std::endl<char,std::char_traits<char>>(poVar1);
  CP::stack<int>::~stack(&b);
  CP::stack<int>::~stack(&a);
  return 0;
}

Assistant:

int main()
{
    std::ios_base::sync_with_stdio(false);std::cin.tie(0);

    int n,m;
    CP::stack<int> a,b;
    std::cin >> n >> m;
    for (int i = 0;i < n;i++) {
        int x;
        std::cin >> x;
        a.push(x);
    }
    for (int i = 0;i < m;i++) {
        int x;
        std::cin >> x;
        b.push(x);
    }
    std::cout << "a.compare_reserve(b) = " << a.compare_reserve(b) << std::endl;
    std::cout << "b.compare_reserve(a) = " << b.compare_reserve(a) << std::endl;
}